

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_extensions.cpp
# Opt level: O0

bool density_tests::set_thread_priority(thread_priority i_priority)

{
  uint uVar1;
  int local_10;
  int result;
  int priority;
  thread_priority i_priority_local;
  
  local_10 = 0;
  switch(i_priority) {
  case idle:
    local_10 = 0x13;
    break;
  case low:
    local_10 = 10;
    break;
  case normal:
    local_10 = 0;
    break;
  case high:
    local_10 = -10;
    break;
  case critical:
    local_10 = -0x14;
  }
  uVar1 = nice(local_10);
  printf("nice() returned %d\n",(ulong)uVar1);
  return uVar1 != 0xffffffff;
}

Assistant:

bool set_thread_priority(thread_priority i_priority)
    {
        int priority = 0;
        switch (i_priority)
        {
        case density_tests::idle:
            priority = 19;
            break;
        case density_tests::low:
            priority = 10;
            break;
        case density_tests::normal:
            priority = 0;
            break;
        case density_tests::high:
            priority = -10;
            break;
        case density_tests::critical:
            priority = -20;
            break;
        default:
            break;
        }

        int result = nice(priority);
        printf("nice() returned %d\n", result);
        return result != -1;
    }